

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive.cpp
# Opt level: O0

void __thiscall
SerializeArchiveNull_WriteAnInt_Test::TestBody(SerializeArchiveNull_WriteAnInt_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_a8;
  Message local_a0;
  size_t local_98;
  unsigned_long local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_1;
  Message local_70;
  size_t local_68;
  unsigned_long local_60;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  int local_34;
  undefined1 local_30 [8];
  null writer;
  SerializeArchiveNull_WriteAnInt_Test *this_local;
  
  writer.super_writer_base<pstore::serialize::archive::details::null_policy>._24_8_ = this;
  pstore::serialize::archive::null::null((null *)local_30);
  local_34 = 0x2a;
  pstore::serialize::archive::writer_base<pstore::serialize::archive::details::null_policy>::
  put<int>((writer_base<pstore::serialize::archive::details::null_policy> *)local_30,&local_34);
  local_60 = 4;
  local_68 = pstore::serialize::archive::
             writer_base<pstore::serialize::archive::details::null_policy>::bytes_consumed
                       ((writer_base<pstore::serialize::archive::details::null_policy> *)local_30);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_58,"sizeof (int)","writer.bytes_consumed ()",&local_60,&local_68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_archive.cpp"
               ,0x4e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  local_90 = 4;
  local_98 = pstore::serialize::archive::
             writer_base<pstore::serialize::archive::details::null_policy>::bytes_produced
                       ((writer_base<pstore::serialize::archive::details::null_policy> *)local_30);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_88,"sizeof (int)","writer.bytes_produced ()",&local_90,&local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_archive.cpp"
               ,0x4f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  pstore::serialize::archive::null::~null((null *)local_30);
  return;
}

Assistant:

TEST (SerializeArchiveNull, WriteAnInt) {
    pstore::serialize::archive::null writer;
    writer.put (42);
    EXPECT_EQ (sizeof (int), writer.bytes_consumed ());
    EXPECT_EQ (sizeof (int), writer.bytes_produced ());
}